

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::changeElement(SPxLPBase<double> *this,int i,int j,double *val,bool scale)

{
  uint uVar1;
  int iVar2;
  Item *this_00;
  Item *this_01;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar4;
  int j_local;
  int i_local;
  double local_58;
  ulong uStack_50;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_48;
  double local_38;
  
  if (-1 < (j | i)) {
    this_01 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
              (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[i].idx;
    this_00 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
              (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[j].idx;
    local_58 = *val;
    uStack_50 = 0;
    j_local = j;
    i_local = i;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_48,
               &(this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    local_38 = Tolerances::epsilon(local_48._M_ptr);
    local_58 = ABS(local_58);
    uStack_50 = uStack_50 & 0x7fffffffffffffff;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    if (local_58 <= local_38) {
      iVar2 = SVectorBase<double>::pos((SVectorBase<double> *)this_01,j);
      if ((-1 < iVar2) &&
         (iVar2 = SVectorBase<double>::pos((SVectorBase<double> *)this_00,i), -1 < iVar2)) {
        uVar1 = SVectorBase<double>::pos((SVectorBase<double> *)this_01,j);
        SVectorBase<double>::remove((SVectorBase<double> *)this_01,(char *)(ulong)uVar1);
        uVar1 = SVectorBase<double>::pos((SVectorBase<double> *)this_00,i);
        SVectorBase<double>::remove((SVectorBase<double> *)this_00,(char *)(ulong)uVar1);
      }
    }
    else {
      if (scale) {
        (*this->lp_scaler->_vptr_SPxScaler[0x2a])
                  (SUB84(*val,0),this->lp_scaler,this,i,(ulong)(uint)j);
        uVar3 = extraout_XMM0_Da;
        uVar4 = extraout_XMM0_Db;
      }
      else {
        uVar3 = SUB84(*val,0);
        uVar4 = (undefined4)((ulong)*val >> 0x20);
      }
      local_58 = (double)CONCAT44(uVar4,uVar3);
      local_48._M_ptr = (element_type *)CONCAT44(uVar4,uVar3);
      iVar2 = SVectorBase<double>::pos((SVectorBase<double> *)this_01,j);
      if ((-1 < iVar2) &&
         (iVar2 = SVectorBase<double>::pos((SVectorBase<double> *)this_00,i), -1 < iVar2)) {
        iVar2 = SVectorBase<double>::pos((SVectorBase<double> *)this_01,j);
        (this_01->data).super_SVectorBase<double>.m_elem[iVar2].val = local_58;
        iVar2 = SVectorBase<double>::pos((SVectorBase<double> *)this_00,i);
        (this_00->data).super_SVectorBase<double>.m_elem[iVar2].val = local_58;
        return;
      }
      LPRowSetBase<double>::add2(&this->super_LPRowSetBase<double>,i,1,&j_local,(double *)&local_48)
      ;
      LPColSetBase<double>::add2
                (&this->super_LPColSetBase<double>,j_local,1,&i_local,(double *)&local_48);
    }
  }
  return;
}

Assistant:

virtual void changeElement(int i, int j, const R& val, bool scale = false)
   {
      if(i < 0 || j < 0)
         return;

      SVectorBase<R>& row = rowVector_w(i);
      SVectorBase<R>& col = colVector_w(j);

      if(isNotZero(val, this->tolerances()->epsilon()))
      {
         R newVal;

         if(scale)
         {
            assert(_isScaled);
            assert(lp_scaler);
            newVal = lp_scaler->scaleElement(*this, i, j, val);
         }
         else
            newVal = val;

         if(row.pos(j) >= 0 && col.pos(i) >= 0)
         {
            row.value(row.pos(j)) = newVal;
            col.value(col.pos(i)) = newVal;
         }
         else
         {
            LPRowSetBase<R>::add2(i, 1, &j, &newVal);
            LPColSetBase<R>::add2(j, 1, &i, &newVal);
         }
      }
      else if(row.pos(j) >= 0 && col.pos(i) >= 0)
      {
         row.remove(row.pos(j));
         col.remove(col.pos(i));
      }

      assert(isConsistent());
   }